

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PopSnapshot(cmMakefile *this,bool reportError)

{
  cmStateSnapshot *this_00;
  pointer ppcVar1;
  bool bVar2;
  undefined1 local_50 [32];
  
  this_00 = &this->StateSnapshot;
  bVar2 = cmStateSnapshot::CanPopPolicyScope(this_00);
  if (bVar2) {
    do {
      if ((reportError & 1U) != 0) {
        local_50._0_8_ = (cmState *)(local_50 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"cmake_policy PUSH without matching POP","");
        ppcVar1 = (this->ExecutionStatusStack).
                  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((this->ExecutionStatusStack).
            super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
            super__Vector_impl_data._M_start != ppcVar1) {
          ppcVar1[-1]->NestedError = true;
        }
        cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)local_50,
                            &this->Backtrace);
        if ((cmState *)local_50._0_8_ != (cmState *)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
        }
        reportError = false;
      }
      PopPolicy(this);
      bVar2 = cmStateSnapshot::CanPopPolicyScope(this_00);
    } while (bVar2);
  }
  cmState::Pop((cmStateSnapshot *)local_50,
               (this->GlobalGenerator->CMakeInstance->State)._M_t.
               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
               super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl,this_00);
  (this->StateSnapshot).Position.Position = local_50._16_8_;
  this_00->State = (cmState *)local_50._0_8_;
  (this->StateSnapshot).Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_50._8_8_;
  bVar2 = cmStateSnapshot::IsValid(this_00);
  if (bVar2) {
    return;
  }
  __assert_fail("this->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                ,0x11b2,"void cmMakefile::PopSnapshot(bool)");
}

Assistant:

void cmMakefile::PopSnapshot(bool reportError)
{
  // cmStateSnapshot manages nested policy scopes within it.
  // Since the scope corresponding to the snapshot is closing,
  // reject any still-open nested policy scopes with an error.
  while (this->StateSnapshot.CanPopPolicyScope()) {
    if (reportError) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         "cmake_policy PUSH without matching POP");
      reportError = false;
    }
    this->PopPolicy();
  }

  this->StateSnapshot = this->GetState()->Pop(this->StateSnapshot);
  assert(this->StateSnapshot.IsValid());
}